

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O0

string * __thiscall
ast::CallExpression::toString_abi_cxx11_(string *__return_storage_ptr__,CallExpression *this)

{
  size_type sVar1;
  const_reference ppEVar2;
  ostream *this_00;
  int local_1a0;
  int i;
  ostringstream local_190 [8];
  ostringstream msg;
  CallExpression *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  ast::operator<<((ostream *)local_190,this->function);
  std::operator<<((ostream *)local_190,"(");
  local_1a0 = 0;
  while( true ) {
    sVar1 = std::vector<ast::Expr_*,_std::allocator<ast::Expr_*>_>::size(&this->arguments);
    if ((int)sVar1 <= local_1a0) break;
    if (0 < local_1a0) {
      sVar1 = std::vector<ast::Expr_*,_std::allocator<ast::Expr_*>_>::size(&this->arguments);
      if (local_1a0 + 1 <= (int)sVar1) {
        std::operator<<((ostream *)local_190,", ");
      }
    }
    ppEVar2 = std::vector<ast::Expr_*,_std::allocator<ast::Expr_*>_>::operator[]
                        (&this->arguments,(long)local_1a0);
    ast::operator<<((ostream *)local_190,*ppEVar2);
    local_1a0 = local_1a0 + 1;
  }
  this_00 = std::operator<<((ostream *)local_190,")");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string ast::CallExpression::toString() const
{
    std::ostringstream msg;
    msg << function;
    msg << "(";
    for(int i{0}; i < (int)arguments.size(); i++){
        if(i > 0 && i+1 <= (int)arguments.size()){
            msg << ", ";
        }
        msg << arguments[i];
    }
    msg << ")" << std::endl;
    return msg.str();
}